

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

void If_Dec7Cofactor(word *t,int iVar,int fCof1,word *r)

{
  word wVar1;
  byte bVar2;
  word *r_local;
  int fCof1_local;
  int iVar_local;
  word *t_local;
  
  if ((-1 < iVar) && (iVar < 7)) {
    if (iVar == 6) {
      if (fCof1 == 0) {
        wVar1 = *t;
        r[1] = wVar1;
        *r = wVar1;
      }
      else {
        wVar1 = t[1];
        r[1] = wVar1;
        *r = wVar1;
      }
    }
    else {
      bVar2 = (byte)iVar;
      if (fCof1 == 0) {
        *r = *t & (Truth6[iVar] ^ 0xffffffffffffffff) |
             (*t & (Truth6[iVar] ^ 0xffffffffffffffff)) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f);
        r[1] = t[1] & (Truth6[iVar] ^ 0xffffffffffffffff) |
               (t[1] & (Truth6[iVar] ^ 0xffffffffffffffff)) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f);
      }
      else {
        *r = *t & Truth6[iVar] | (*t & Truth6[iVar]) >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f);
        r[1] = t[1] & Truth6[iVar] | (t[1] & Truth6[iVar]) >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f);
      }
    }
    return;
  }
  __assert_fail("iVar >= 0 && iVar < 7",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                ,0x24b,"void If_Dec7Cofactor(word *, int, int, word *)");
}

Assistant:

static inline void If_Dec7Cofactor( word t[2], int iVar, int fCof1, word r[2] )
{
    assert( iVar >= 0 && iVar < 7 );
    if ( iVar == 6 )
    {
        if ( fCof1 )
            r[0] = r[1] = t[1];
        else
            r[0] = r[1] = t[0];
    }
    else
    {
        if ( fCof1 )
        {
            r[0] = (t[0] & Truth6[iVar]) | ((t[0] & Truth6[iVar]) >> (1<<iVar));
            r[1] = (t[1] & Truth6[iVar]) | ((t[1] & Truth6[iVar]) >> (1<<iVar));
        }
        else
        {
            r[0] = (t[0] &~Truth6[iVar]) | ((t[0] &~Truth6[iVar]) << (1<<iVar));
            r[1] = (t[1] &~Truth6[iVar]) | ((t[1] &~Truth6[iVar]) << (1<<iVar));
        }
    }
}